

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceManager.cpp
# Opt level: O3

bool __thiscall ResourceManager::add(ResourceManager *this,Resource *res,bool load)

{
  pointer *pppRVar1;
  iterator __position;
  int iVar2;
  Resource *local_10;
  
  __position._M_current =
       (this->resources).super__Vector_base<Resource_*,_std::allocator<Resource_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_10 = res;
  if (__position._M_current ==
      (this->resources).super__Vector_base<Resource_*,_std::allocator<Resource_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Resource*,std::allocator<Resource*>>::_M_realloc_insert<Resource*const&>
              ((vector<Resource*,std::allocator<Resource*>> *)this,__position,&local_10);
  }
  else {
    *__position._M_current = res;
    pppRVar1 = &(this->resources).super__Vector_base<Resource_*,_std::allocator<Resource_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppRVar1 = *pppRVar1 + 1;
  }
  if ((load) && (iVar2 = (*local_10->_vptr_Resource[1])(), (char)iVar2 == '\0')) {
    return false;
  }
  return true;
}

Assistant:

bool ResourceManager::add(Resource* res, bool load)
{
   // We have to add the resource even if loading fails, if we want to be able
   // to continue without the resource (e.g. samples).
   resources.push_back(res);
   if (load) {
      if (!res->load())
         return false;
   }
   return true;
}